

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_1::createMultipleUniqueResourcesTest<vkt::api::(anonymous_namespace)::Buffer>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  Parameters *params_00;
  string local_108;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_e8;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_c8;
  Parameters params_local;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_98;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_78;
  Environment env;
  
  params_00 = (Parameters *)params.size;
  params_local.usage = (VkBufferUsageFlags)params.size;
  params_local.size = (VkDeviceSize)context;
  Environment::Environment(&env,(Context *)this,1);
  Buffer::create((Move<vk::Handle<(vk::HandleType)8>_> *)&local_c8,&env,(Resources *)&params_local,
                 params_00);
  local_108.field_2._M_allocated_capacity = (size_type)local_c8.m_data.deleter.m_device;
  local_108.field_2._8_8_ = local_c8.m_data.deleter.m_allocator;
  local_108._M_dataplus._M_p = (pointer)local_c8.m_data.object.m_internal;
  local_108._M_string_length = (size_type)local_c8.m_data.deleter.m_deviceIface;
  local_c8.m_data.object.m_internal = 0;
  local_c8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_c8.m_data.deleter.m_device = (VkDevice)0x0;
  local_c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_c8);
  Buffer::create((Move<vk::Handle<(vk::HandleType)8>_> *)&local_e8,&env,(Resources *)&params_local,
                 params_00);
  local_c8.m_data.deleter.m_device = local_e8.m_data.deleter.m_device;
  local_c8.m_data.deleter.m_allocator = local_e8.m_data.deleter.m_allocator;
  local_c8.m_data.object.m_internal = local_e8.m_data.object.m_internal;
  local_c8.m_data.deleter.m_deviceIface = local_e8.m_data.deleter.m_deviceIface;
  local_e8.m_data.object.m_internal = 0;
  local_e8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_e8.m_data.deleter.m_device = (VkDevice)0x0;
  local_e8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_e8);
  Buffer::create((Move<vk::Handle<(vk::HandleType)8>_> *)&local_98,&env,(Resources *)&params_local,
                 params_00);
  local_e8.m_data.deleter.m_device = local_98.m_data.deleter.m_device;
  local_e8.m_data.deleter.m_allocator = local_98.m_data.deleter.m_allocator;
  local_e8.m_data.object.m_internal = local_98.m_data.object.m_internal;
  local_e8.m_data.deleter.m_deviceIface = local_98.m_data.deleter.m_deviceIface;
  local_98.m_data.object.m_internal = 0;
  local_98.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_98.m_data.deleter.m_device = (VkDevice)0x0;
  local_98.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_98);
  Buffer::create((Move<vk::Handle<(vk::HandleType)8>_> *)&local_78,&env,(Resources *)&params_local,
                 params_00);
  local_98.m_data.deleter.m_device = local_78.m_data.deleter.m_device;
  local_98.m_data.deleter.m_allocator = local_78.m_data.deleter.m_allocator;
  local_98.m_data.object.m_internal = local_78.m_data.object.m_internal;
  local_98.m_data.deleter.m_deviceIface = local_78.m_data.deleter.m_deviceIface;
  local_78.m_data.object.m_internal = 0;
  local_78.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_78.m_data.deleter.m_device = (VkDevice)0x0;
  local_78.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_78);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_98);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_e8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_c8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"Ok",(allocator<char> *)&local_c8);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleUniqueResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env		(context, 1u);
	const typename Object::Resources	res0	(env, params);
	const typename Object::Resources	res1	(env, params);
	const typename Object::Resources	res2	(env, params);
	const typename Object::Resources	res3	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res0, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res1, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res2, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res3, params));
	}

	return tcu::TestStatus::pass("Ok");
}